

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O2

UnicodeSet * __thiscall icu_63::UnicodeSet::retainAll(UnicodeSet *this,UnicodeSet *c)

{
  if ((this->stringSpan == (UnicodeSetStringSpan *)0x0 && this->bmpSet == (BMPSet *)0x0) &&
     ((this->fFlags & 1) == 0)) {
    retain(this,c->list,c->len,'\0');
    UVector::retainAll(this->strings,c->strings);
  }
  return this;
}

Assistant:

UnicodeSet& UnicodeSet::retainAll(const UnicodeSet& c) {
    if (isFrozen() || isBogus()) {
        return *this;
    }
    retain(c.list, c.len, 0);
    strings->retainAll(*c.strings);
    return *this;
}